

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53lxx.cpp
# Opt level: O0

void __thiscall
VL53LXX::VL53LXX(VL53LXX *this,uint8_t port,uint8_t address,int16_t xshutGPIOPin,bool ioMode2v8,
                float *calib)

{
  I2Cgeneric *this_00;
  uint local_30;
  uint i;
  float *calib_local;
  bool ioMode2v8_local;
  int16_t xshutGPIOPin_local;
  uint8_t address_local;
  uint8_t port_local;
  VL53LXX *this_local;
  
  this->_vptr_VL53LXX = (_func_int **)&PTR___cxa_pure_virtual_00110a18;
  this->xshutGPIOPin = xshutGPIOPin;
  this->ioMode2v8 = ioMode2v8;
  std::__cxx11::string::string((string *)&this->gpioFilename);
  std::mutex::mutex(&this->fileAccessMutex);
  this->gpioInitialized = false;
  this_00 = (I2Cgeneric *)operator_new(0x20);
  I2Cdev::I2Cdev((I2Cdev *)this_00,port,address);
  this->i2c = this_00;
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    this->calib[local_30] = calib[local_30];
  }
  if (xshutGPIOPin != -1) {
    powerOn(this);
  }
  return;
}

Assistant:

VL53LXX::VL53LXX(uint8_t port, const uint8_t address, const int16_t xshutGPIOPin, bool ioMode2v8, float *calib):
    xshutGPIOPin(xshutGPIOPin),
    ioMode2v8(ioMode2v8)
{
    #ifdef BUILD_I2C_DEV
    this->i2c = new I2Cdev(port, address);
    #endif

    for(unsigned int i = 0; i < CALIB_SIZE; i++){
    this->calib[i] = calib[i];
    }

    if(xshutGPIOPin != -1){
        this->powerOn();
    }
}